

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling1d.cpp
# Opt level: O0

int __thiscall ncnn::Pooling1D::forward(Pooling1D *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  float *pfVar8;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar9;
  float val_2;
  int k_1;
  float sum_3;
  float *sptr_1;
  int j_4;
  float *outptr_4;
  float *ptr_4;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int area;
  float sum_2;
  int sx0;
  int j_3;
  float *outptr_3;
  float *ptr_3;
  int q_5;
  int wtailpad;
  float val;
  int k;
  float max_2;
  float *sptr;
  int j_2;
  float *outptr_2;
  float *ptr_2;
  int q_4;
  int outw;
  Mat bottom_blob_bordered;
  int iw_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  float max_1;
  int iw1;
  int iw0;
  int j;
  float *outptr;
  float *inptr;
  int q_2;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  size_t elemsize;
  int h;
  int w;
  Allocator *in_stack_fffffffffffffc48;
  size_t in_stack_fffffffffffffc50;
  undefined8 in_stack_fffffffffffffc58;
  int iVar10;
  Mat *in_stack_fffffffffffffc60;
  void *__ptr;
  int *piVar11;
  undefined4 uVar12;
  Pooling1D *in_stack_fffffffffffffda8;
  int local_228;
  float local_224;
  int local_214;
  int local_200;
  int local_1fc;
  float local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  long local_1e8;
  long local_1e0;
  int local_1d4;
  int local_1d0;
  float local_1cc;
  int local_1bc;
  int local_1b8;
  float local_1b4;
  float *local_1b0;
  int local_1a4;
  long local_1a0;
  int local_198;
  int local_194;
  long *local_188;
  long *local_180;
  int local_16c;
  undefined1 *local_160;
  long *local_158;
  long *local_150;
  int local_134;
  long *local_130;
  int local_114;
  long *local_110;
  long local_f8;
  int local_74;
  long *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  long *local_50;
  long *local_48;
  undefined1 *local_40;
  int local_20;
  undefined4 local_1c;
  undefined1 *local_18;
  
  local_194 = *(int *)((long)in_RSI + 0x2c);
  local_198 = (int)in_RSI[6];
  local_1a0 = in_RSI[2];
  iVar10 = (int)((ulong)in_stack_fffffffffffffc58 >> 0x20);
  local_188 = in_RDX;
  local_180 = in_RSI;
  if (*(int *)(in_RDI + 0xe4) == 0) {
    if (*(int *)(in_RDI + 0xf0) == 0) {
      local_68 = &stack0xfffffffffffffd90;
      __ptr = (void *)0x0;
      piVar11 = (int *)0x0;
      uVar12 = 0;
      make_padding(in_stack_fffffffffffffda8,(Mat *)0x0,(Mat *)0x0,(Option *)0x0);
      local_160 = &stack0xfffffffffffffd90;
      if (__ptr != (void *)0x0) {
        local_40 = local_160;
      }
      local_16c = -100;
      local_60 = &stack0xfffffffffffffd90;
      if (piVar11 != (int *)0x0) {
        local_1c = 0xffffffff;
        LOCK();
        local_20 = *piVar11;
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if ((local_20 == 1) && (__ptr != (void *)0x0)) {
          local_18 = local_60;
          free(__ptr);
        }
      }
    }
    else {
      Mat::create(in_stack_fffffffffffffc60,iVar10,(int)in_stack_fffffffffffffc58,
                  in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_158 = local_188;
      bVar9 = true;
      if (*local_188 != 0) {
        local_48 = local_188;
        bVar9 = local_188[8] * (long)(int)local_188[7] == 0;
      }
      if (bVar9) {
        local_16c = -100;
      }
      else {
        if (*(int *)(in_RDI + 0xd0) == 0) {
          for (local_1d4 = 0; local_1d4 < local_198; local_1d4 = local_1d4 + 1) {
            local_130 = local_180;
            local_134 = local_1d4;
            local_1e0 = *local_180 +
                        (long)*(int *)((long)local_180 + 0x2c) * (long)local_1d4 * local_180[2];
            local_70 = local_188;
            local_74 = local_1d4;
            local_1e8 = *local_188 +
                        (long)*(int *)((long)local_188 + 0x2c) * (long)local_1d4 * local_188[2];
            for (local_1ec = 0; local_1ec < *(int *)(in_RDI + 0xf4); local_1ec = local_1ec + 1) {
              local_1fc = (local_194 * local_1ec) / *(int *)(in_RDI + 0xf4);
              local_1f4 = (local_194 * (local_1ec + 1) + *(int *)(in_RDI + 0xf4) + -1) /
                          *(int *)(in_RDI + 0xf4);
              local_1f8 = *(float *)(local_1e0 + (long)local_1fc * 4);
              local_1f0 = local_1fc;
              for (; local_1fc < local_1f4; local_1fc = local_1fc + 1) {
                pfVar8 = std::max<float>(&local_1f8,(float *)(local_1e0 + (long)local_1fc * 4));
                local_1f8 = *pfVar8;
              }
              *(float *)(local_1e8 + (long)local_1ec * 4) = local_1f8;
            }
          }
        }
        else if (*(int *)(in_RDI + 0xd0) == 1) {
          for (local_200 = 0; local_200 < local_198; local_200 = local_200 + 1) {
            lVar2 = *local_180;
            iVar10 = *(int *)((long)local_180 + 0x2c);
            lVar3 = local_180[2];
            lVar4 = *local_188;
            iVar1 = *(int *)((long)local_188 + 0x2c);
            lVar5 = local_188[2];
            for (local_214 = 0; local_214 < *(int *)(in_RDI + 0xf4); local_214 = local_214 + 1) {
              local_228 = (local_194 * local_214) / *(int *)(in_RDI + 0xf4);
              iVar6 = (local_194 * (local_214 + 1) + *(int *)(in_RDI + 0xf4) + -1) /
                      *(int *)(in_RDI + 0xf4);
              iVar7 = iVar6 - local_228;
              local_224 = 0.0;
              for (; local_228 < iVar6; local_228 = local_228 + 1) {
                local_224 = *(float *)(lVar2 + (long)iVar10 * (long)local_200 * lVar3 +
                                      (long)local_228 * 4) + local_224;
              }
              *(float *)(lVar4 + (long)iVar1 * (long)local_200 * lVar5 + (long)local_214 * 4) =
                   local_224 / (float)iVar7;
            }
          }
        }
        local_16c = 0;
      }
    }
  }
  else {
    Mat::create(in_stack_fffffffffffffc60,iVar10,in_stack_fffffffffffffc50,in_stack_fffffffffffffc48
               );
    local_150 = local_188;
    bVar9 = true;
    if (*local_188 != 0) {
      local_50 = local_188;
      bVar9 = local_188[8] * (long)(int)local_188[7] == 0;
    }
    if (bVar9) {
      local_16c = -100;
    }
    else {
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_1a4 = 0; local_1a4 < local_198; local_1a4 = local_1a4 + 1) {
          local_110 = local_180;
          local_114 = local_1a4;
          local_1b0 = (float *)(*local_180 +
                               (long)*(int *)((long)local_180 + 0x2c) * (long)local_1a4 *
                               local_180[2]);
          local_1b4 = *local_1b0;
          for (local_1b8 = 0; local_1b8 < local_194; local_1b8 = local_1b8 + 1) {
            pfVar8 = std::max<float>(&local_1b4,local_1b0 + local_1b8);
            local_1b4 = *pfVar8;
          }
          local_f8 = (long)local_1a4;
          *(float *)(*local_188 + local_f8 * 4) = local_1b4;
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_1bc = 0; local_1bc < local_198; local_1bc = local_1bc + 1) {
          local_1cc = 0.0;
          for (local_1d0 = 0; local_1d0 < local_194; local_1d0 = local_1d0 + 1) {
            local_1cc = *(float *)(*local_180 +
                                   (long)*(int *)((long)local_180 + 0x2c) * (long)local_1bc *
                                   local_180[2] + (long)local_1d0 * 4) + local_1cc;
          }
          *(float *)(*local_188 + (long)local_1bc * 4) = local_1cc / (float)local_194;
        }
      }
      local_16c = 0;
    }
  }
  return local_16c;
}

Assistant:

int Pooling1D::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling1D     input %d x %d  pad = %d %d  ksize=%d  stride=%d", w, h, pad_left, pad_right, kernel_w, stride_w);
    if (global_pooling)
    {
        top_blob.create(h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float max = ptr[0];
                for (int i = 0; i < w; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob.row(q);

                float sum = 0.f;
                for (int i = 0; i < w; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / w;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        top_blob.create(out_w, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;

                    float max = inptr[iw0];
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        max = std::max(max, inptr[iw]);
                    }

                    outptr[j] = max;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* inptr = bottom_blob.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < out_w; j++)
                {
                    // floor div
                    const int iw0 = w * j / out_w;
                    // ceil div
                    const int iw1 = (w * (j + 1) + out_w - 1) / out_w;
                    const int wk = iw1 - iw0;

                    float sum = 0;
                    for (int iw = iw0; iw < iw1; iw++)
                    {
                        sum += inptr[iw];
                    }

                    outptr[j] = sum / wk;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;

    top_blob.create(outw, h, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < h; q++)
        {
            const float* ptr = bottom_blob_bordered.row(q);
            float* outptr = top_blob.row(q);

            for (int j = 0; j < outw; j++)
            {
                const float* sptr = ptr + j * stride_w;

                float max = sptr[0];

                for (int k = 0; k < kernel_w; k++)
                {
                    float val = sptr[k];
                    max = std::max(max, val);
                }

                outptr[j] = max;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    int sx0 = j * stride_w;

                    float sum = 0;
                    int area = 0;

                    for (int kj = 0; kj < kernel_w; kj++)
                    {
                        int sx = sx0 + kj;

                        if (sx < pad_left)
                            continue;

                        if (sx >= w - pad_right - wtailpad)
                            break;

                        float val = ptr[sx];
                        sum += val;
                        area += 1;
                    }

                    outptr[j] = sum / area;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < h; q++)
            {
                const float* ptr = bottom_blob_bordered.row(q);
                float* outptr = top_blob.row(q);

                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = ptr + j * stride_w;

                    float sum = 0;

                    for (int k = 0; k < kernel_w; k++)
                    {
                        float val = sptr[k];
                        sum += val;
                    }

                    outptr[j] = sum / kernel_w;
                }
            }
        }
    }

    return 0;
}